

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

ValuedAction
despot::POMCP::Evaluate
          (VNode *root,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,DSPOMDP *model,POMCPPrior *prior)

{
  _Rb_tree_header *p_Var1;
  POMCPPrior *pPVar2;
  bool bVar3;
  int iVar4;
  uint action;
  int iVar5;
  ACT_TYPE _action;
  pointer ppSVar6;
  undefined4 extraout_var;
  QNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_00;
  mapped_type *ppVVar7;
  long lVar8;
  long lVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  mapped_type vnode;
  _Base_ptr p_Var12;
  undefined1 auVar13 [16];
  double dVar14;
  ValuedAction VVar15;
  OBS_TYPE obs;
  double reward;
  double local_b0;
  ulong local_a8;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_a0;
  POMCPPrior *local_98;
  double local_90;
  double local_88;
  VNode *local_80;
  long local_78;
  double local_70;
  ulong local_68;
  State *local_60;
  DSPOMDP *local_58;
  RandomStreams *local_50;
  double local_48;
  ValuedAction local_40;
  
  ppSVar6 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    lVar9 = 0;
    do {
      ppSVar6[lVar9]->scenario_id = (int)lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
  }
  ppSVar6 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_a0 = particles;
  local_80 = root;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppSVar6) {
    local_b0 = 0.0;
  }
  else {
    local_b0 = 0.0;
    uVar11 = 0;
    local_98 = prior;
    local_58 = model;
    local_50 = streams;
    do {
      local_60 = ppSVar6[uVar11];
      local_68 = uVar11;
      iVar4 = (*model->_vptr_DSPOMDP[0x16])(model);
      local_78 = CONCAT44(extraout_var,iVar4);
      local_70 = 1.0;
      local_88 = 0.0;
      iVar4 = 0;
      vnode = local_80;
      do {
        bVar3 = RandomStreams::Exhausted(streams);
        if (bVar3) break;
        if (vnode == (VNode *)0x0) {
          action = POMCPPrior::GetAction(local_98,local_60);
        }
        else {
          action = UpperBoundAction(vnode,0.0);
        }
        lVar8 = local_78;
        RandomStreams::Entry(streams,*(int *)(local_78 + 0x10));
        iVar5 = (*model->_vptr_DSPOMDP[2])(model,lVar8,(ulong)action,&local_48,&local_a8);
        dVar14 = local_48 * local_70;
        local_70 = local_70 * DAT_00193de8;
        if ((char)iVar5 == '\0') {
          local_90 = dVar14;
          (*local_98->_vptr_POMCPPrior[6])(local_98,(ulong)action,local_a8);
          RandomStreams::Advance(streams);
          iVar4 = iVar4 + 1;
          if (vnode != (VNode *)0x0) {
            this = VNode::Child(vnode,action);
            this_00 = QNode::children(this);
            p_Var1 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
            p_Var12 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var10 = &p_Var1->_M_header;
            for (; p_Var12 != (_Base_ptr)0x0;
                p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < local_a8]) {
              if (*(ulong *)(p_Var12 + 1) >= local_a8) {
                p_Var10 = p_Var12;
              }
            }
            p_Var12 = &p_Var1->_M_header;
            if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
               (p_Var12 = p_Var10, local_a8 < *(ulong *)(p_Var10 + 1))) {
              p_Var12 = &p_Var1->_M_header;
            }
            if ((_Rb_tree_header *)p_Var12 != p_Var1) {
              ppVVar7 = std::
                        map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                        ::operator[](this_00,&local_a8);
              vnode = *ppVVar7;
              dVar14 = local_90;
              goto LAB_0016b8c6;
            }
          }
          vnode = (mapped_type)0x0;
          dVar14 = local_90;
        }
LAB_0016b8c6:
        local_88 = local_88 + dVar14;
        streams = local_50;
        model = local_58;
      } while ((char)iVar5 == '\0');
      pPVar2 = local_98;
      if (0 < iVar4) {
        do {
          RandomStreams::Back(streams);
          (*pPVar2->_vptr_POMCPPrior[7])(pPVar2);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      (*model->_vptr_DSPOMDP[0x17])(model,local_78);
      local_b0 = local_b0 + local_88;
      uVar11 = local_68 + 1;
      ppSVar6 = (local_a0->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(local_a0->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6 >> 3
                             ));
  }
  _action = UpperBoundAction(local_80,0.0);
  lVar8 = (long)(local_a0->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(local_a0->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
  lVar9 = lVar8 >> 3;
  auVar13._8_4_ = (int)(lVar8 >> 0x23);
  auVar13._0_8_ = lVar9;
  auVar13._12_4_ = 0x45300000;
  ValuedAction::ValuedAction
            (&local_40,_action,
             local_b0 /
             ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)));
  VVar15._4_4_ = 0;
  VVar15.action = local_40.action;
  VVar15.value = local_40.value;
  return VVar15;
}

Assistant:

ValuedAction POMCP::Evaluate(VNode* root, vector<State*>& particles,
	RandomStreams& streams, const DSPOMDP* model, POMCPPrior* prior) {
	double value = 0;

	for (int i = 0; i < particles.size(); i++)
		particles[i]->scenario_id = i;

	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		VNode* cur = root;
		State* copy = model->Copy(particle);
		double discount = 1.0;
		double val = 0;
		int steps = 0;

		// Simulate until all random numbers are consumed
		while (!streams.Exhausted()) {
			ACT_TYPE action =
				(cur != NULL) ?
					UpperBoundAction(cur, 0) : prior->GetAction(*particle);

			double reward;
			OBS_TYPE obs;
			bool terminal = model->Step(*copy, streams.Entry(copy->scenario_id),
				action, reward, obs);

			val += discount * reward;
			discount *= Globals::Discount();

			if (!terminal) {
				prior->Add(action, obs);
				streams.Advance();
				steps++;

				if (cur != NULL) {
					QNode* qnode = cur->Child(action);
					map<OBS_TYPE, VNode*>& vnodes = qnode->children();
					cur = vnodes.find(obs) != vnodes.end() ? vnodes[obs] : NULL;
				}
			} else {
				break;
			}
		}

		// Reset random streams and prior
		for (int i = 0; i < steps; i++) {
			streams.Back();
			prior->PopLast();
		}

		model->Free(copy);

		value += val;
	}

	return ValuedAction(UpperBoundAction(root, 0), value / particles.size());
}